

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.c
# Opt level: O3

int vorbis_synthesis_lapout(vorbis_dsp_state *v,float ***pcm)

{
  float fVar1;
  int iVar2;
  vorbis_info *pvVar3;
  long *plVar4;
  ulong uVar5;
  long lVar6;
  float **ppfVar7;
  float *pfVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  
  pvVar3 = v->vi;
  plVar4 = (long *)pvVar3->codec_setup;
  uVar5 = v->W;
  lVar6 = plVar4[uVar5];
  bVar9 = (char)plVar4[0x2d2] + 1;
  uVar16 = *plVar4 >> (bVar9 & 0x3f);
  uVar12 = plVar4[1] >> (bVar9 & 0x3f);
  iVar10 = v->pcm_returned;
  if (iVar10 < 0) {
    return 0;
  }
  iVar11 = (int)uVar12;
  if (v->centerW == (long)iVar11) {
    iVar15 = pvVar3->channels;
    if (0 < (long)iVar15) {
      ppfVar7 = v->pcm;
      uVar12 = uVar12 & 0xffffffff;
      lVar18 = 0;
      do {
        if (0 < iVar11) {
          pfVar8 = ppfVar7[lVar18];
          uVar14 = 0;
          do {
            fVar1 = pfVar8[uVar14];
            pfVar8[uVar14] = pfVar8[uVar12 + uVar14];
            pfVar8[uVar12 + uVar14] = fVar1;
            uVar14 = uVar14 + 1;
          } while (uVar12 != uVar14);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar15);
    }
    v->pcm_current = v->pcm_current - iVar11;
    iVar10 = iVar10 - iVar11;
    v->pcm_returned = iVar10;
    v->centerW = 0;
  }
  iVar15 = (int)uVar16;
  if ((uVar5 ^ v->lW) == 1) {
    iVar2 = pvVar3->channels;
    if ((long)iVar2 < 1) {
      iVar17 = (iVar11 - iVar15) / 2;
    }
    else {
      ppfVar7 = v->pcm;
      iVar17 = (iVar11 - iVar15) / 2;
      lVar18 = 0;
      do {
        if (1 < iVar15 + iVar11) {
          pfVar8 = ppfVar7[lVar18];
          lVar13 = (ulong)(uint)((iVar15 + iVar11) / 2) + 1;
          do {
            pfVar8[(long)iVar17 + lVar13 + -2] = pfVar8[lVar13 + -2];
            lVar13 = lVar13 + -1;
          } while (1 < lVar13);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar2);
    }
  }
  else {
    if (v->lW != 0) goto LAB_001d3212;
    iVar17 = pvVar3->channels;
    if (0 < (long)iVar17) {
      ppfVar7 = v->pcm;
      lVar18 = 0;
      do {
        if (0 < iVar15) {
          pfVar8 = ppfVar7[lVar18];
          lVar13 = (uVar16 & 0xffffffff) + 1;
          do {
            pfVar8[(long)iVar11 + ((lVar13 + -2) - (long)iVar15)] = pfVar8[lVar13 + -2];
            lVar13 = lVar13 + -1;
          } while (1 < lVar13);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar17);
    }
    iVar17 = iVar11 - iVar15;
  }
  iVar10 = iVar10 + iVar17;
  v->pcm_returned = iVar10;
  v->pcm_current = v->pcm_current + iVar17;
LAB_001d3212:
  if (pcm != (float ***)0x0) {
    iVar15 = pvVar3->channels;
    if (0 < (long)iVar15) {
      lVar18 = 0;
      do {
        v->pcmret[lVar18] = v->pcm[lVar18] + iVar10;
        lVar18 = lVar18 + 1;
      } while (iVar15 != lVar18);
    }
    *pcm = v->pcmret;
  }
  return ((int)(lVar6 >> (bVar9 & 0x3f)) + iVar11) - iVar10;
}

Assistant:

int vorbis_synthesis_lapout(vorbis_dsp_state *v,float ***pcm){
  vorbis_info *vi=v->vi;
  codec_setup_info *ci=vi->codec_setup;
  int hs=ci->halfrate_flag;

  int n=ci->blocksizes[v->W]>>(hs+1);
  int n0=ci->blocksizes[0]>>(hs+1);
  int n1=ci->blocksizes[1]>>(hs+1);
  int i,j;

  if(v->pcm_returned<0)return 0;

  /* our returned data ends at pcm_returned; because the synthesis pcm
     buffer is a two-fragment ring, that means our data block may be
     fragmented by buffering, wrapping or a short block not filling
     out a buffer.  To simplify things, we unfragment if it's at all
     possibly needed. Otherwise, we'd need to call lapout more than
     once as well as hold additional dsp state.  Opt for
     simplicity. */

  /* centerW was advanced by blockin; it would be the center of the
     *next* block */
  if(v->centerW==n1){
    /* the data buffer wraps; swap the halves */
    /* slow, sure, small */
    for(j=0;j<vi->channels;j++){
      float *p=v->pcm[j];
      for(i=0;i<n1;i++){
        float temp=p[i];
        p[i]=p[i+n1];
        p[i+n1]=temp;
      }
    }

    v->pcm_current-=n1;
    v->pcm_returned-=n1;
    v->centerW=0;
  }

  /* solidify buffer into contiguous space */
  if((v->lW^v->W)==1){
    /* long/short or short/long */
    for(j=0;j<vi->channels;j++){
      float *s=v->pcm[j];
      float *d=v->pcm[j]+(n1-n0)/2;
      for(i=(n1+n0)/2-1;i>=0;--i)
        d[i]=s[i];
    }
    v->pcm_returned+=(n1-n0)/2;
    v->pcm_current+=(n1-n0)/2;
  }else{
    if(v->lW==0){
      /* short/short */
      for(j=0;j<vi->channels;j++){
        float *s=v->pcm[j];
        float *d=v->pcm[j]+n1-n0;
        for(i=n0-1;i>=0;--i)
          d[i]=s[i];
      }
      v->pcm_returned+=n1-n0;
      v->pcm_current+=n1-n0;
    }
  }

  if(pcm){
    int i;
    for(i=0;i<vi->channels;i++)
      v->pcmret[i]=v->pcm[i]+v->pcm_returned;
    *pcm=v->pcmret;
  }

  return(n1+n-v->pcm_returned);

}